

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fade.cpp
# Opt level: O1

bool __thiscall
Fade::seekValue(Fade *this,DTreeNode *node,int *rel,int *ordering,int numOfRel,int **l,int *u,
               double *val)

{
  int iVar1;
  Database pTVar2;
  pointer ppVar3;
  int *piVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int *piVar11;
  int iVar12;
  pointer ppdVar13;
  int *piVar14;
  double dVar15;
  double dVar16;
  
  iVar8 = (*rel + -1) % numOfRel;
  pTVar2 = this->_data;
  ppVar3 = this->_ids[node->_id].
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = *l;
  dVar15 = pTVar2[ppVar3[ordering[(iVar8 >> 0x1f & numOfRel) + iVar8]].first].
           super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar4[ppVar3[ordering[(iVar8 >> 0x1f & numOfRel) + iVar8]].first]]
           [ppVar3[ordering[(iVar8 >> 0x1f & numOfRel) + iVar8]].second];
  lVar7 = (long)ppVar3[ordering[*rel]].first;
  lVar9 = (long)ppVar3[ordering[*rel]].second;
  ppdVar13 = pTVar2[lVar7].super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  dVar16 = ppdVar13[piVar4[lVar7]][lVar9];
  bVar5 = (bool)(-(dVar16 != dVar15) & 1);
  if ((dVar16 != dVar15) || (NAN(dVar16) || NAN(dVar15))) {
    if (dVar15 < ppdVar13[u[lVar7]][lVar9] || dVar15 == ppdVar13[u[lVar7]][lVar9]) {
      piVar11 = u + lVar7;
      do {
        piVar14 = piVar4 + lVar7;
        iVar8 = *piVar11;
        iVar12 = 1;
        if ((*piVar14 <= iVar8) && (dVar16 < dVar15)) {
          iVar12 = 1;
          iVar10 = *piVar14;
          while (iVar1 = iVar10 + iVar12, iVar1 < iVar8) {
            *piVar14 = iVar1;
            iVar12 = iVar12 << (ppdVar13[iVar1][lVar9] < dVar15);
            iVar8 = *piVar11;
            if ((iVar8 < iVar1) || (iVar10 = iVar1, dVar15 <= ppdVar13[iVar1][lVar9]))
            goto LAB_0011fa6b;
          }
          *piVar14 = iVar8;
          iVar12 = iVar8 - iVar10;
        }
LAB_0011fa6b:
        if (1 < iVar12) {
          uVar6 = (ulong)*piVar14;
          if (dVar15 <= ppdVar13[uVar6 - 1][lVar9]) {
            iVar12 = *piVar14 - iVar12;
            do {
              iVar8 = (int)uVar6;
              iVar10 = (iVar12 + iVar8) / 2;
              if ((ppdVar13[(long)iVar10 + -1][lVar9] <= dVar15 &&
                   dVar15 != ppdVar13[(long)iVar10 + -1][lVar9]) &&
                 (dVar15 <= ppdVar13[iVar10][lVar9])) {
                *piVar14 = iVar10;
                break;
              }
              if (ppdVar13[iVar10][lVar9] < dVar15) {
                iVar12 = iVar10 + 1;
              }
              else {
                uVar6 = (ulong)(iVar10 - 1);
              }
              iVar8 = (int)uVar6;
            } while (iVar12 < iVar8);
            iVar8 = (iVar8 + iVar12) / 2;
            if (dVar15 <= ppdVar13[(long)iVar8 + -1][lVar9]) {
              iVar8 = iVar8 + -1;
            }
            *piVar14 = iVar8;
          }
        }
        dVar15 = ppdVar13[*piVar14][lVar9];
        iVar8 = (*rel + 1) % numOfRel;
        *rel = iVar8;
        lVar7 = (long)ppVar3[ordering[iVar8]].first;
        lVar9 = (long)ppVar3[ordering[iVar8]].second;
        ppdVar13 = pTVar2[lVar7].super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        dVar16 = ppdVar13[piVar4[lVar7]][lVar9];
        bVar5 = (bool)(-(dVar16 != dVar15) & 1);
        if ((dVar16 == dVar15) && (!NAN(dVar16) && !NAN(dVar15))) goto LAB_0011fb79;
        piVar11 = u + lVar7;
      } while (dVar15 < ppdVar13[*piVar11][lVar9] || dVar15 == ppdVar13[*piVar11][lVar9]);
    }
  }
  else {
LAB_0011fb79:
    *val = dVar16;
  }
  return bVar5;
}

Assistant:

bool Fade::seekValue(DTreeNode* node, int &rel, int* ordering, int numOfRel,
		int* &l, int* u, double &val)
{
	int nodeID = node->_id;

	int index = mod(rel - 1, numOfRel);
	int i = _ids[nodeID][ordering[index]].first;
	int j = _ids[nodeID][ordering[index]].second;

	/* this is the value we are seeking. */
	double max = _data[i][l[i]][j];

	double min;
	while (true)
	{
		i = _ids[nodeID][ordering[rel]].first;
		j = _ids[nodeID][ordering[rel]].second;
		min = _data[i][l[i]][j];

		/* If we found the value then we return. */
		if (min == max)
		{
			val = min;
			return false;
		}
		/* else we seek a the least upper bound */
		else
		{
			/* If the value we seek is bigger than the last value in the relation we can return. */
			if (max > _data[i][u[i]][j])
				return true;

			/* We seek the value with increasing leaps. */
			int leap = 1;
			while (l[i] <= u[i] && min < max)
			{
				if (l[i] + leap < u[i])
				{
					l[i] += leap;
					min = _data[i][l[i]][j];
					if (min < max)
						leap *= 2;
				}
				else
				{
					leap = u[i] - l[i];
					l[i] = u[i];
					min = _data[i][l[i]][j];
					break;
				}
			}

			/*
			 * When we found an upper bound we need to find the least upper bound;
			 * we backtrack using binary search.
			 */
			if (leap > 1 && max <= _data[i][l[i] - 1][j])
			{
				int high = l[i], low = l[i] - leap, mid = 0;
				while (high > low && high != low)
				{
					mid = (high + low) / 2;
					if (max > _data[i][mid - 1][j] && max <= _data[i][mid][j])
					{
						l[i] = mid;
						break;
					}
					else if (max <= _data[i][mid][j])
						high = mid - 1;
					else
						low = mid + 1;
				}

				mid = (high + low) / 2;
				if (_data[i][mid - 1][j] >= max)
					mid -= 1;

				l[i] = mid;
			}

			/*
			 * Once the least upper bound is found we set max to that value and
			 * continue with the next relation.
			 */
			max = _data[i][l[i]][j];
			rel = (rel + 1) % numOfRel;
		}
	}

	return false;
}